

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_ast.c
# Opt level: O2

void free_variable_decl(gvisitor_t *self,gnode_variable_decl_t *node)

{
  uint32_t uVar1;
  size_t sVar2;
  gnode_r *pgVar3;
  gnode_var_t *p;
  size_t _i;
  ulong uVar4;
  
  uVar1 = (node->base).refcount;
  if (uVar1 != 0) {
    (node->base).refcount = uVar1 - 1;
    return;
  }
  if (node->decls != (gnode_r *)0x0) {
    sVar2 = node->decls->n;
    for (uVar4 = 0; pgVar3 = node->decls, sVar2 != uVar4; uVar4 = uVar4 + 1) {
      if (uVar4 < pgVar3->n) {
        p = (gnode_var_t *)pgVar3->p[uVar4];
      }
      else {
        p = (gnode_var_t *)0x0;
      }
      free_variable(self,p);
    }
    free(pgVar3->p);
    free(node->decls);
  }
  free(node);
  return;
}

Assistant:

static void free_variable_decl (gvisitor_t *self, gnode_variable_decl_t *node) {
    CHECK_REFCOUNT(node);
    if (node->decls) {
        gnode_array_each(node->decls, {free_variable(self, (gnode_var_t *)val);});
        gnode_array_free(node->decls);
    }
    mem_free((gnode_t*)node);
}